

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_schemes.c
# Opt level: O0

char * nni_http_stream_scheme(char *upper)

{
  int iVar1;
  int local_1c;
  int i;
  char *upper_local;
  
  local_1c = 0;
  while( true ) {
    if (http_schemes[local_1c].upper == (char *)0x0) {
      return (char *)0x0;
    }
    iVar1 = strcmp(http_schemes[local_1c].upper,upper);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return http_schemes[local_1c].lower;
}

Assistant:

const char *
nni_http_stream_scheme(const char *upper)
{
	for (int i = 0; http_schemes[i].upper != NULL; i++) {
		if (strcmp(http_schemes[i].upper, upper) == 0) {
			return (http_schemes[i].lower);
		}
	}
	return (NULL);
}